

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O0

void __thiscall sfm::FeatureSet::compute_sift(FeatureSet *this,ConstPtr *image)

{
  pointer *this_00;
  float x;
  float y;
  Descriptor *pDVar1;
  size_t sVar2;
  Descriptors *__x;
  size_type sVar3;
  size_type sVar4;
  Descriptor *pDVar5;
  reference this_01;
  element_type *this_02;
  reference this_03;
  uchar *px;
  Vector<float,_2> local_f8;
  reference local_f0;
  Descriptor *d;
  size_t i;
  size_t offset;
  __normal_iterator<features::Sift::Descriptor_*,_std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>_>
  local_d0;
  shared_ptr<const_core::Image<unsigned_char>_> local_c8 [2];
  undefined1 local_a8 [8];
  Sift sift;
  Descriptors descr;
  ConstPtr *image_local;
  FeatureSet *this_local;
  
  std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::vector
            ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
             &sift.descriptors.
              super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  features::Sift::Sift((Sift *)local_a8,&(this->opts).sift_opts);
  std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(local_c8,image);
  features::Sift::set_image((Sift *)local_a8,local_c8);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(local_c8);
  features::Sift::process((Sift *)local_a8);
  __x = features::Sift::get_descriptors((Sift *)local_a8);
  std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::operator=
            ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
             &sift.descriptors.
              super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__x);
  features::Sift::~Sift((Sift *)local_a8);
  this_00 = &sift.descriptors.
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_d0._M_current =
       (Descriptor *)
       std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::begin
                 ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *
                  )this_00);
  offset = (size_t)std::
                   vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
                   end((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                        *)this_00);
  std::
  sort<__gnu_cxx::__normal_iterator<features::Sift::Descriptor*,std::vector<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>>,bool(*)(features::Sift::Descriptor_const&,features::Sift::Descriptor_const&)>
            (local_d0,(__normal_iterator<features::Sift::Descriptor_*,_std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>_>
                       )offset,anon_unknown_1::compare_scale<features::Sift::Descriptor>);
  sVar3 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::size
                    (&this->positions);
  i = sVar3;
  sVar4 = std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::size
                    ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                      *)&sift.descriptors.
                         super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::resize
            (&this->positions,sVar3 + sVar4);
  sVar2 = i;
  sVar3 = std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::size
                    ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                      *)&sift.descriptors.
                         super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>::
  resize(&this->colors,sVar2 + sVar3);
  d = (Descriptor *)0x0;
  while( true ) {
    pDVar1 = d;
    pDVar5 = (Descriptor *)
             std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
             size((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *
                  )&sift.descriptors.
                    super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (pDVar5 <= pDVar1) break;
    local_f0 = std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
               ::operator[]((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                             *)&sift.descriptors.
                                super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)d);
    math::Vector<float,_2>::Vector(&local_f8,&local_f0->x,&local_f0->y);
    this_01 = std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::
              operator[](&this->positions,(long)(d->data).v + (i - 0x10));
    math::Vector<float,_2>::operator=(this_01,&local_f8);
    this_02 = std::
              __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)image);
    x = local_f0->x;
    y = local_f0->y;
    this_03 = std::
              vector<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
              ::operator[](&this->colors,(long)(d->data).v + (i - 0x10));
    px = math::Vector<unsigned_char,_3>::begin(this_03);
    core::Image<unsigned_char>::linear_at(this_02,x,y,px);
    d = (Descriptor *)((long)&d->x + 1);
  }
  std::swap<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>
            ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
             &sift.descriptors.
              super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&this->sift_descriptors);
  std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::~vector
            ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
             &sift.descriptors.
              super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void
FeatureSet::compute_sift (core::ByteImage::ConstPtr image)
{
    /* Compute features. */
    Sift::Descriptors descr;
    {
        Sift sift(this->opts.sift_opts);
        sift.set_image(image);
        sift.process();
        descr = sift.get_descriptors();
    }

    /* Sort features by scale for low-res matching. */
    std::sort(descr.begin(), descr.end(), compare_scale<sfm::Sift::Descriptor>);

    /* Prepare and copy to data structures. */
    std::size_t offset = this->positions.size();
    this->positions.resize(offset + descr.size());
    this->colors.resize(offset + descr.size());

    for (std::size_t i = 0; i < descr.size(); ++i)
    {
        Sift::Descriptor const& d = descr[i];
        this->positions[offset + i] = math::Vec2f(d.x, d.y);
        image->linear_at(d.x, d.y, this->colors[offset + i].begin());
    }

    /* Keep SIFT descriptors. */
    std::swap(descr, this->sift_descriptors);
}